

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_spec.cpp
# Opt level: O3

void parsePSPFile(filebuf *file)

{
  pointer paVar1;
  ushort uVar2;
  int iVar3;
  optional<Rgba> oVar4;
  uint uVar5;
  __integer_from_chars_result_type<unsigned_long> _Var6;
  string line;
  string local_70;
  size_type local_50;
  vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_> *local_48;
  ulong local_40;
  unsigned_long local_38;
  
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  readLine(file,&local_70);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_70,"JASC-PAL");
  if (iVar3 == 0) {
    local_70._M_string_length = 0;
    *local_70._M_dataplus._M_p = '\0';
    readLine(file,&local_70);
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_70,"0100");
    if (iVar3 == 0) {
      local_70._M_string_length = 0;
      *local_70._M_dataplus._M_p = '\0';
      readLine(file,&local_70);
      local_38 = 0;
      _Var6 = std::from_chars<unsigned_long>
                        (local_70._M_dataplus._M_p,
                         local_70._M_dataplus._M_p + local_70._M_string_length,&local_38,10);
      if ((_Var6.ec == 0) &&
         ((long)_Var6.ptr - (long)local_70._M_dataplus._M_p == local_70._M_string_length)) {
        uVar2 = (ushort)local_38;
        if ((uint)options.nbPalettes * (uint)options.nbColorsPerPal < ((uint)local_38 & 0xffff)) {
          warning("PSP file contains %u colors, but there can only be %u; ignoring extra");
          uVar2 = (ushort)options.nbPalettes * (ushort)options.nbColorsPerPal;
        }
        if (options.palSpec.
            super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            options.palSpec.
            super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          options.palSpec.
          super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl
          .super__Vector_impl_data._M_finish =
               options.palSpec.
               super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
        }
        if (uVar2 != 0) {
          local_40 = (ulong)-(uint)uVar2;
          uVar5 = 1;
          local_48 = &options.palSpec;
          do {
            local_70._M_string_length = 0;
            *local_70._M_dataplus._M_p = '\0';
            readLine(file,&local_70);
            local_50 = 0;
            oVar4 = parseColor(&local_70,&local_50,(uint16_t)uVar5);
            if (((uint5)oVar4.super__Optional_base<Rgba,_true,_true>._M_payload.
                        super__Optional_payload_base<Rgba> & 0x100000000) == 0) break;
            if (local_50 != local_70._M_string_length) {
              error("Failed to parse color #%u (\"%s\"): trailing characters after blue component",
                    (ulong)uVar5,local_70._M_dataplus._M_p);
              break;
            }
            if ((ushort)((ushort)(uVar5 - 1) % (ushort)options.nbColorsPerPal) == 0) {
              if (options.palSpec.
                  super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  options.palSpec.
                  super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::
                _M_realloc_insert<>(local_48,(iterator)
                                             options.palSpec.
                                             super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish);
              }
              else {
                paVar1 = options.palSpec.
                         super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                paVar1->_M_elems[0].red = '\0';
                paVar1->_M_elems[0].green = '\0';
                paVar1->_M_elems[0].blue = '\0';
                paVar1->_M_elems[0].alpha = '\0';
                paVar1->_M_elems[1].red = '\0';
                paVar1->_M_elems[1].green = '\0';
                paVar1->_M_elems[1].blue = '\0';
                paVar1->_M_elems[1].alpha = '\0';
                paVar1->_M_elems[2].red = '\0';
                paVar1->_M_elems[2].green = '\0';
                paVar1->_M_elems[2].blue = '\0';
                paVar1->_M_elems[2].alpha = '\0';
                paVar1->_M_elems[3].red = '\0';
                paVar1->_M_elems[3].green = '\0';
                paVar1->_M_elems[3].blue = '\0';
                paVar1->_M_elems[3].alpha = '\0';
                options.palSpec.
                super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     options.palSpec.
                     super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
            }
            *(_Storage<Rgba,_true> *)
             (options.palSpec.
              super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
              _M_impl.super__Vector_impl_data._M_finish[-1]._M_elems +
             (ushort)((uVar5 - 1 & 0xffff) % (uint)options.nbColorsPerPal)) =
                 oVar4.super__Optional_base<Rgba,_true,_true>._M_payload.
                 super__Optional_payload_base<Rgba>._M_payload;
            iVar3 = (int)local_40 + uVar5;
            uVar5 = uVar5 + 1;
          } while (iVar3 != 0);
        }
      }
      else {
        error("Invalid \"number of colors\" line in PSP file (%s)",local_70._M_dataplus._M_p);
      }
    }
    else {
      error("Unsupported PSP palette file version \"%s\"",local_70._M_dataplus._M_p);
    }
  }
  else {
    error("Palette file does not appear to be a PSP palette file");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

static void parsePSPFile(std::filebuf &file) {
	// https://www.selapa.net/swatches/colors/fileformats.php#psp_pal

	std::string line;
	readLine(file, line);
	if (line != "JASC-PAL") {
		error("Palette file does not appear to be a PSP palette file");
		return;
	}

	line.clear();
	readLine(file, line);
	if (line != "0100") {
		error("Unsupported PSP palette file version \"%s\"", line.c_str());
		return;
	}

	line.clear();
	readLine(file, line);
	std::string::size_type n = 0;
	std::optional<uint16_t> nbColors = parseDec<uint16_t>(line, n);
	if (!nbColors || n != line.length()) {
		error("Invalid \"number of colors\" line in PSP file (%s)", line.c_str());
		return;
	}

	if (*nbColors > options.nbColorsPerPal * options.nbPalettes) {
		warning("PSP file contains %" PRIu16 " colors, but there can only be %" PRIu16
		        "; ignoring extra",
		        *nbColors, options.nbColorsPerPal * options.nbPalettes);
		nbColors = options.nbColorsPerPal * options.nbPalettes;
	}

	options.palSpec.clear();

	for (uint16_t i = 0; i < *nbColors; ++i) {
		line.clear();
		readLine(file, line);

		n = 0;
		std::optional<Rgba> color = parseColor(line, n, i + 1);
		if (!color) {
			return;
		}
		if (n != line.length()) {
			error("Failed to parse color #%" PRIu16
			      " (\"%s\"): trailing characters after blue component",
			      i + 1, line.c_str());
			return;
		}

		if (i % options.nbColorsPerPal == 0) {
			options.palSpec.emplace_back();
		}
		options.palSpec.back()[i % options.nbColorsPerPal] = *color;
	}
}